

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O3

int Wla_ManSolve(Wla_Man_t *pWla,Wlc_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  Wlc_Ntk_t *pAbs;
  Aig_Man_t *pAig;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  int level;
  char *__format;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  timespec ts;
  timespec local_50;
  double local_40;
  double local_38;
  
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  pWla->nIters = 1;
  iVar1 = -1;
  if (1 < pPars->nIterMax) {
    uVar5 = 1;
    do {
      if (pPars->fVerbose != 0) {
        printf("\nIteration %d:\n",uVar5);
      }
      pAbs = Wla_ManCreateAbs(pWla);
      pAig = Wla_ManBitBlast(pWla,pAbs);
      Wlc_NtkFree(pAbs);
      iVar1 = Wla_ManSolveInt(pWla,pAig);
      Aig_ManStop(pAig);
      if (iVar1 != -1) goto LAB_00895e32;
      if (pPars->pFuncStop != (_func_int_int *)0x0) {
        iVar1 = (*pPars->pFuncStop)(pPars->RunId);
        if (iVar1 != 0) break;
      }
      Wla_ManRefine(pWla);
      uVar4 = pWla->nIters + 1;
      uVar5 = (ulong)uVar4;
      pWla->nIters = uVar4;
    } while ((int)uVar4 < pPars->nIterMax);
    iVar1 = -1;
  }
LAB_00895e32:
  if (pPars->fVerbose != 0) {
    putchar(10);
  }
  printf("Abstraction ");
  pcVar3 = "timed out";
  if (iVar1 == 1) {
    pcVar3 = "is successfully proved";
  }
  __format = "resulted in a real CEX";
  if (iVar1 != 0) {
    __format = pcVar3;
  }
  printf(__format);
  printf(" after %d iterations. ",(ulong)(uint)pWla->nIters);
  level = 3;
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  dVar8 = (double)(lVar6 - lVar7);
  local_38 = dVar8 / 1000000.0;
  Abc_Print(level,"%9.2f sec\n");
  if (pPars->fVerbose != 0) {
    Abc_Print(level,"PDRA reused %d clauses.\n",(ulong)(uint)pWla->nTotalCla);
    if (pPars->fVerbose != 0) {
      Abc_Print(level,"%s =","PDR          ");
      dVar9 = 0.0;
      if (lVar6 != lVar7) {
        dVar9 = ((double)pWla->tPdr * 100.0) / dVar8;
      }
      local_40 = 0.0;
      if (lVar6 != lVar7) {
        local_40 = (dVar8 * 100.0) / dVar8;
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)pWla->tPdr / 1000000.0,dVar9);
      Abc_Print(level,"%s =","CEX Refine   ");
      dVar9 = 0.0;
      if (lVar6 != lVar7) {
        dVar9 = ((double)pWla->tCbr * 100.0) / dVar8;
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)pWla->tCbr / 1000000.0,dVar9);
      Abc_Print(level,"%s =","Proof Refine ");
      dVar9 = 0.0;
      if (lVar6 != lVar7) {
        dVar9 = ((double)pWla->tPbr * 100.0) / dVar8;
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)pWla->tPbr / 1000000.0,dVar9);
      Abc_Print(level,"%s =","Misc.        ");
      dVar10 = (double)((lVar6 - lVar7) - (pWla->tPdr + pWla->tCbr + pWla->tPbr));
      dVar9 = 0.0;
      if (lVar6 != lVar7) {
        dVar9 = (dVar10 * 100.0) / dVar8;
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10 / 1000000.0,dVar9);
      Abc_Print(level,"%s =","Total        ");
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",local_38,local_40);
    }
  }
  return iVar1;
}

Assistant:

int Wla_ManSolve( Wla_Man_t * pWla, Wlc_Par_t * pPars )
{
    abctime clk = Abc_Clock();
    abctime tTotal;
    Wlc_Ntk_t * pAbs = NULL;
    Aig_Man_t * pAig = NULL;

    int RetValue = -1;

    // perform refinement iterations
    for ( pWla->nIters = 1; pWla->nIters < pPars->nIterMax; ++pWla->nIters )
    {
        if ( pPars->fVerbose )
            printf( "\nIteration %d:\n", pWla->nIters );

        pAbs = Wla_ManCreateAbs( pWla );

        pAig = Wla_ManBitBlast( pWla, pAbs );
        Wlc_NtkFree( pAbs );

        RetValue = Wla_ManSolveInt( pWla, pAig );
        Aig_ManStop( pAig );

        if ( RetValue != -1 || (pPars->pFuncStop && pPars->pFuncStop( pPars->RunId)) )
            break;

        Wla_ManRefine( pWla );
    }

    // report the result
    if ( pPars->fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 )
        printf( "resulted in a real CEX" );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", pWla->nIters );
    tTotal = Abc_Clock() - clk;
    Abc_PrintTime( 1, "Time", tTotal );

    if ( pPars->fVerbose )
        Abc_Print( 1, "PDRA reused %d clauses.\n", pWla->nTotalCla );
    if ( pPars->fVerbose )
    {
        ABC_PRTP( "PDR          ", pWla->tPdr,                          tTotal );
        ABC_PRTP( "CEX Refine   ", pWla->tCbr,                          tTotal );
        ABC_PRTP( "Proof Refine ", pWla->tPbr,                          tTotal );
        ABC_PRTP( "Misc.        ", tTotal - pWla->tPdr - pWla->tCbr - pWla->tPbr,   tTotal );
        ABC_PRTP( "Total        ", tTotal,                              tTotal );
    }

    return RetValue;
}